

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>
::LogConstraintGroup
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AcoshId>_>
           *this,BasicFlatModelAPI *be)

{
  BasicLogger *pBVar1;
  string_view key;
  string_view key_00;
  string_view key_01;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_260;
  char *local_250;
  int cg;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter wrt;
  
  cg = 0;
  pBVar1 = BasicConstraintKeeper::GetLogger(&this->super_BasicConstraintKeeper);
  if (pBVar1 != (BasicLogger *)0x0) {
    wrt.super_BasicWriter<char>.buffer_ = &wrt.buffer_.super_Buffer<char>;
    wrt.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_004bb5f8;
    wrt.buffer_.super_Buffer<char>.ptr_ = wrt.buffer_.data_;
    wrt.buffer_.super_Buffer<char>.size_ = 0;
    wrt.buffer_.super_Buffer<char>.capacity_ = 500;
    wrt.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_004bb640;
    jw.wrt_ = &wrt;
    jw.kind_ = Unset;
    jw.n_written_ = 0;
    local_250 = BasicConstraintKeeper::GetShortTypeName(&this->super_BasicConstraintKeeper);
    key._M_str = (char *)0x8;
    key._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[](&local_260,key)
    ;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_260,
               &local_250);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              (&local_260);
    local_250 = ConGroupName(0);
    key_00._M_str = (char *)0x9;
    key_00._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (&local_260,key_00);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_260,
               &local_250);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              (&local_260);
    key_01._M_str = (char *)0xf;
    key_01._M_len = (size_t)&jw;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (&local_260,key_01);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_260,&cg);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              (&local_260);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&jw);
    fmt::BasicWriter<char>::write<>(&wrt.super_BasicWriter<char>,(BasicCStringRef<char>)0x37fbf3);
    pBVar1 = BasicConstraintKeeper::GetLogger(&this->super_BasicConstraintKeeper);
    BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>(pBVar1,&wrt);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&wrt);
  }
  return;
}

Assistant:

void LogConstraintGroup(
      BasicFlatModelAPI& be) override {
    auto cg = GetConstraintGroup(be);
    if (cg>=0 && GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["CON_GROUP"] = ConGroupName(cg);
        jw["CON_GROUP_index"] = cg;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }